

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# W3CPropagator.h
# Opt level: O3

TraceID __thiscall
jaegertracing::propagation::
W3CPropagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
::readTraceID(W3CPropagator<const_opentracing::v3::HTTPHeadersReader_&,_const_opentracing::v3::HTTPHeadersWriter_&>
              *this,istream *in)

{
  pointer pcVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  char in_R8B;
  TraceID TVar4;
  string buffer;
  string lowStr;
  string highStr;
  string local_80;
  string local_60;
  string local_40;
  
  utils::HexParsing::readSegment_abi_cxx11_(&local_80,(HexParsing *)in,(istream *)0x20,0x2d,in_R8B);
  if (local_80._M_string_length == 0x20) {
    pcVar1 = local_80._M_dataplus._M_p + 0x10;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_40,local_80._M_dataplus._M_p,pcVar1);
    uVar2 = utils::HexParsing::decodeHex<unsigned_long>(&local_40);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              ((string *)&local_60,pcVar1,local_80._M_dataplus._M_p + local_80._M_string_length);
    uVar3 = utils::HexParsing::decodeHex<unsigned_long>(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    uVar3 = 0;
    uVar2 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  TVar4._low = uVar3;
  TVar4._high = uVar2;
  return TVar4;
}

Assistant:

TraceID readTraceID(std::istream& in) const
    {
        TraceID traceID;
        constexpr auto kMaxChars = static_cast<size_t>(32);
        auto buffer = utils::HexParsing::readSegment(in, kMaxChars, '-');

        if (buffer.empty() || buffer.size() != kMaxChars) {
            return TraceID();
        }

        auto beginLowStr = std::end(buffer) - kMaxChars / 2;
        const std::string highStr(std::begin(buffer), beginLowStr);
        auto high = utils::HexParsing::decodeHex<uint64_t>(highStr);
        const std::string lowStr(beginLowStr, std::end(buffer));
        auto low = utils::HexParsing::decodeHex<uint64_t>(lowStr);

        return TraceID(high, low);
    }